

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O3

int array_compare(char *array1,char *array2)

{
  long lVar1;
  
  if (0 < (long)numvars) {
    lVar1 = 0;
    do {
      if (*(int *)(array1 + lVar1 * 4) != *(int *)(array2 + lVar1 * 4)) {
        return 1;
      }
      lVar1 = lVar1 + 1;
    } while (numvars != lVar1);
  }
  return 0;
}

Assistant:

static int
array_compare(
  const char * array1,
  const char * array2)
{
    int i;
    int *intarray1, *intarray2;

    intarray1 = (int *) array1;
    intarray2 = (int *) array2;

    for (i = 0; i < numvars; i++) {
        if (intarray1[i] != intarray2[i]) return(1);
    }
    return(0);

}